

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

FxExpression * __thiscall FxFloatCast::Resolve(FxFloatCast *this,FCompileContext *ctx)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  FxConstant *this_00;
  char *pcVar3;
  double val;
  FxExpression *x_2;
  ExpVal local_50;
  FxConstant *local_40;
  FxExpression *x_1;
  ExpVal constval;
  FxExpression *x;
  FCompileContext *ctx_local;
  FxFloatCast *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar1 = (*this->basex->_vptr_FxExpression[2])(this->basex,ctx);
      this->basex = (FxExpression *)CONCAT44(extraout_var,iVar1);
    }
    if (this->basex == (FxExpression *)0x0) {
      if (this != (FxFloatCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxFloatCast *)0x0;
    }
    else {
      iVar1 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
      if (iVar1 == 1) {
        constval.field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)this->basex;
        this->basex = (FxExpression *)0x0;
        if (this != (FxFloatCast *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxFloatCast *)constval.field_1.pointer;
      }
      else {
        iVar1 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
        if (iVar1 == 0) {
          if (this->basex->ValueType == (PType *)TypeName) {
            uVar2 = (*this->basex->_vptr_FxExpression[3])();
            if ((uVar2 & 1) == 0) {
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Numeric type expected, got a name");
            }
            else {
              FxConstant::GetValue((FxConstant *)&x_2);
              ExpVal::GetName(&local_50);
              pcVar3 = FName::GetChars((FName *)&local_50);
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Numeric type expected, got \"%s\"",pcVar3);
              ExpVal::~ExpVal((ExpVal *)&x_2);
            }
            this_local = (FxFloatCast *)operator_new(0x48);
            FxConstant::FxConstant
                      ((FxConstant *)this_local,0.0,&(this->super_FxExpression).ScriptPosition);
            if (this != (FxFloatCast *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
          }
          else {
            uVar2 = (*this->basex->_vptr_FxExpression[3])();
            if ((uVar2 & 1) != 0) {
              FxConstant::GetValue((FxConstant *)&x_1);
              this_00 = (FxConstant *)operator_new(0x48);
              val = ExpVal::GetFloat((ExpVal *)&x_1);
              FxConstant::FxConstant(this_00,val,&(this->super_FxExpression).ScriptPosition);
              local_40 = this_00;
              if (this != (FxFloatCast *)0x0) {
                (*(this->super_FxExpression)._vptr_FxExpression[1])();
              }
              this_local = (FxFloatCast *)local_40;
              ExpVal::~ExpVal((ExpVal *)&x_1);
            }
          }
        }
        else {
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
          if (this != (FxFloatCast *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxFloatCast *)0x0;
        }
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxFloatCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType->GetRegType() == REGT_FLOAT)
	{
		FxExpression *x = basex;
		basex = NULL;
		delete this;
		return x;
	}
	else if (basex->ValueType->GetRegType() == REGT_INT)
	{
		if (basex->ValueType != TypeName)
		{
			if (basex->isConstant())
			{
				ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
				FxExpression *x = new FxConstant(constval.GetFloat(), ScriptPosition);
				delete this;
				return x;
			}
			return this;
		}
		else
		{
			// Ugh. This should abort, but too many mods fell into this logic hole somewhere, so this seroious error needs to be reduced to a warning. :(
			if (!basex->isConstant()) ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got a name");
			else ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got \"%s\"", static_cast<FxConstant*>(basex)->GetValue().GetName().GetChars());
			FxExpression *x = new FxConstant(0.0, ScriptPosition);
			delete this;
			return x;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
}